

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O0

void * aom_calloc(size_t num,size_t size)

{
  int iVar1;
  size_t in_RSI;
  size_t in_RDI;
  void *x;
  size_t total_size;
  size_t in_stack_fffffffffffffff8;
  void *__s;
  
  iVar1 = check_size_argument_overflow(in_stack_fffffffffffffff8,in_RDI,in_RSI);
  if (iVar1 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = aom_malloc(0x18e2cc);
    if (__s != (void *)0x0) {
      memset(__s,0,in_RDI * in_RSI);
    }
  }
  return __s;
}

Assistant:

void *aom_calloc(size_t num, size_t size) {
  if (!check_size_argument_overflow(num, size, DEFAULT_ALIGNMENT)) return NULL;
  const size_t total_size = num * size;
  void *const x = aom_malloc(total_size);
  if (x) memset(x, 0, total_size);
  return x;
}